

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O1

boolean replay_run_cmdloop(boolean optonly,boolean singlestep,boolean fast)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  nh_option_desc *pnVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  byte *__ptr;
  byte *pbVar12;
  char *pcVar13;
  memfile_tag *pmVar14;
  ulong uVar15;
  long lVar16;
  char *in;
  char cVar17;
  char cVar18;
  ulong uVar19;
  undefined7 in_register_00000031;
  memfile_tag *pmVar20;
  undefined7 in_register_00000039;
  char cVar21;
  ulong uVar22;
  bool bVar23;
  nh_cmd_arg cmdarg;
  int count;
  char valbuf [256];
  char optname [256];
  boolean local_2124;
  nh_cmd_arg local_2120;
  uint local_2118;
  uint local_2114;
  byte *local_2110;
  nh_optvalue local_2108;
  int local_20fc;
  memfile_tag local_20f8 [10];
  memfile local_1ff8;
  
  pnVar4 = birth_options;
  uVar22 = CONCAT71(in_register_00000031,singlestep) & 0xffffffff;
  uVar19 = CONCAT71(in_register_00000039,optonly) & 0xffffffff;
  birth_options = active_birth_options;
  active_birth_options = pnVar4;
  pcVar11 = next_log_token();
  if (pcVar11 == (char *)0x0) {
    __ptr = (byte *)0x0;
  }
  else {
    __ptr = (byte *)strdup(pcVar11);
  }
  if (__ptr == (byte *)0x0) {
    local_2124 = '\0';
  }
  else {
    cVar17 = (char)uVar19;
    cVar21 = (char)uVar22;
    local_2124 = '\0';
    local_2118 = (uint)CONCAT71(in_register_00000031,singlestep);
    local_2114 = (uint)CONCAT71(in_register_00000039,optonly);
    do {
      bVar1 = *__ptr;
      cVar18 = (char)uVar19;
      if (0x3d < bVar1) {
        if (bVar1 != 0x3e) {
          if (bVar1 == 0x54) {
            iVar6 = __isoc99_sscanf(__ptr,"TZ%d",&replay_timezone);
            if (iVar6 != 1) {
              parse_error("Bad timezone offset data.");
            }
          }
          else if (bVar1 == 0x7e) {
            if (((cVar21 != '\0' || cVar17 == '\0') &&
                (pcVar11 = next_log_token(), pcVar11 != (char *)0x0)) &&
               (loginfo.diffs_are_invalid == '\0')) {
              iVar6 = strncmp(pcVar11,"f:",2);
              if (iVar6 != 0) {
                parse_error("Error: incorrect binary diff format.\n");
              }
              iVar8 = base64_strlen(pcVar11 + 2);
              pbVar12 = (byte *)malloc((long)(iVar8 + 2));
              memset(pbVar12,0,(long)(iVar8 + 2));
              base64_decode(pcVar11 + 2,(char *)pbVar12);
              mnew(&local_1ff8,(memfile *)0x0);
              iVar6 = 0;
              local_2110 = pbVar12;
              while ((iVar5 = local_1ff8.len, *pbVar12 != 0 || (pbVar12[1] != 0))) {
                bVar1 = pbVar12[1] >> 6;
                uVar9 = (pbVar12[1] & 0x3f) << 8;
                uVar7 = *pbVar12 | uVar9;
                if (bVar1 - 1 < 2) {
                  iVar10 = local_1ff8.pos + uVar7;
                  if (local_1ff8.len < iVar10) {
                    iVar2 = local_1ff8.len + 0x1000U;
                    if ((int)(local_1ff8.len + 0x1000U) < iVar10) {
                      iVar2 = iVar10;
                    }
                    local_1ff8.len =
                         (~local_1ff8.len + iVar2 & 0xfffff000U) + local_1ff8.len + 0x1000;
                  }
                  if (iVar5 < iVar10) {
                    local_1ff8.buf = (char *)realloc(local_1ff8.buf,(long)local_1ff8.len);
                  }
                  if (bVar1 == 1) {
                    if (diff_base.pos < (int)(iVar6 + uVar7)) {
                      free(local_2110);
                      mfree(&local_1ff8);
                      parse_error("binary diff reads past EOF");
                    }
                    memcpy(local_1ff8.buf + local_1ff8.pos,diff_base.buf + iVar6,(ulong)uVar7);
                    local_1ff8.pos = local_1ff8.pos + uVar7;
                    pbVar12 = pbVar12 + 2;
                    iVar6 = iVar6 + uVar7;
                  }
                  else {
                    pbVar12 = pbVar12 + 2;
                    uVar19 = (ulong)uVar7;
                    if ((long)iVar8 < (long)(pbVar12 + (uVar19 - (long)local_2110))) {
                      free(local_2110);
                      mfree(&local_1ff8);
                      parse_error("binary diff ends unexpectedly");
                    }
                    memcpy(local_1ff8.buf + local_1ff8.pos,pbVar12,uVar19);
                    local_1ff8.pos = local_1ff8.pos + uVar7;
                    pbVar12 = pbVar12 + uVar19;
                    iVar6 = iVar6 + uVar7;
                  }
                }
                else {
                  if (bVar1 != 0) {
                    free(local_2110);
                    mfree(&local_1ff8);
                    parse_error("unknown command in binary diff");
                  }
                  uVar3 = uVar7 - 0x4000;
                  if (uVar9 < 0x2000) {
                    uVar3 = uVar7;
                  }
                  if (iVar6 < (int)uVar3) {
                    free(local_2110);
                    mfree(&local_1ff8);
                    parse_error("diff seeks past start of file");
                  }
                  pbVar12 = pbVar12 + 2;
                  iVar6 = iVar6 - uVar3;
                }
              }
              uVar19 = (ulong)local_2114;
              if ((char)local_2114 == '\0') {
                uVar22 = (ulong)local_2118;
                if (fast == '\0') {
                  mfree(&diff_base);
                  mnew(&diff_base,(memfile *)0x0);
                  if (loginfo.cmds_are_invalid == '\0') {
                    savegame(&diff_base);
                  }
                }
                if (((fast == '\0') && (diff_base.pos == local_1ff8.pos)) &&
                   (iVar6 = bcmp(diff_base.buf,local_1ff8.buf,(long)local_1ff8.pos), iVar6 == 0)) {
                  mfree(&local_1ff8);
                }
                else {
                  if (((fast == '\0') && (local_1ff8.pos == diff_base.pos)) &&
                     (loginfo.cmds_are_invalid == '\0')) {
                    local_20f8[0].next = (memfile_tag *)0x0;
                    local_20f8[0].tagdata = 99;
                    local_20f8[0].tagtype = MTAG_START;
                    local_20f8[0].pos = 0;
                    if (0 < diff_base.pos) {
                      uVar15 = 0;
LAB_001b993c:
                      if (local_1ff8.buf[uVar15] == diff_base.buf[uVar15]) goto code_r0x001b9946;
                      lVar16 = 0;
                      pmVar14 = local_20f8;
                      do {
                        for (pmVar20 = diff_base.tags[lVar16]; pmVar20 != (memfile_tag *)0x0;
                            pmVar20 = pmVar20->next) {
                          if ((pmVar20->pos <= (int)uVar15) && (pmVar14->pos <= pmVar20->pos)) {
                            pmVar14 = pmVar20;
                          }
                        }
                        lVar16 = lVar16 + 1;
                      } while (lVar16 != 0x3f1);
                      raw_printf("desync between recording and save at tag (%d, %ld) + %d bytes",
                                 (ulong)pmVar14->tagtype,pmVar14->tagdata,
                                 (ulong)(uint)((int)uVar15 - pmVar14->pos));
                    }
                  }
                  else if (loginfo.cmds_are_invalid == '\0' && fast == '\0') {
                    raw_printf("desync between recording (length %d) and recorded save (length %d)",
                               (ulong)(uint)diff_base.pos,(ulong)(uint)local_1ff8.pos);
                  }
LAB_001b988a:
                  loginfo.out_of_sync = '\x01';
                  mfree(&diff_base);
                  memcpy(&diff_base,&local_1ff8,0x1fc0);
                  if ((fast == '\0') &&
                     (replay_sync_save(),
                     loginfo.cmds_are_invalid == '\0' && loginfo.diffs_are_invalid == '\0')) {
                    loginfo.cmds_are_invalid = '\x01';
                    raw_printf(
                              "The recorded commands seem to be invalid.  Replay will use diffs instead."
                              );
                  }
                }
              }
              else {
                mfree(&diff_base);
                memcpy(&diff_base,&local_1ff8,0x1fc0);
                uVar22 = (ulong)local_2118;
              }
              free(local_2110);
            }
            pnVar4 = active_birth_options;
            if ((char)uVar22 != '\0') {
              active_birth_options = birth_options;
              birth_options = pnVar4;
              return local_2124;
            }
          }
          goto LAB_001b9973;
        }
        if (loginfo.cmds_are_invalid == '\0' && cVar18 == '\0') {
          iVar6 = __isoc99_sscanf(__ptr,">%n",local_20f8);
          if ((iVar6 == -1) || ((int)local_20f8[0].next == 0)) {
LAB_001b9ab3:
            parse_error("Error: Incorrect command spec\n");
          }
          local_1ff8.buf = (char *)((ulong)local_1ff8.buf & 0xffffffff00000000);
          iVar6 = __isoc99_sscanf(__ptr + (int)local_20f8[0].next,"%llx%n",&turntime,&local_1ff8);
          if ((iVar6 < 1) || ((uint)local_1ff8.buf == 0)) goto LAB_001b9ab3;
          lVar16 = (long)(int)local_20f8[0].next;
          local_20f8[0].next =
               (memfile_tag *)
               CONCAT44(local_20f8[0].next._4_4_,(int)(lVar16 + (int)(uint)local_1ff8.buf));
          iVar6 = __isoc99_sscanf(__ptr + lVar16 + (int)(uint)local_1ff8.buf,":%x:%d",&local_1ff8,
                                  &local_20fc);
          if (iVar6 < 2) goto LAB_001b9ab3;
          if (cmdcount < (int)(uint)local_1ff8.buf) goto LAB_001b9ab3;
          pcVar11 = commands[(int)(uint)local_1ff8.buf];
          pbVar12 = (byte *)next_log_token();
          if (pbVar12 == (byte *)0x0) goto LAB_001b9adc;
          bVar1 = *pbVar12;
          if (bVar1 < 0x6f) {
            if (bVar1 == 100) {
              local_2120.argtype = 4;
              pcVar13 = "d:%d";
LAB_001b9797:
              iVar6 = __isoc99_sscanf(pbVar12,pcVar13,&local_2120.field_1);
              bVar23 = iVar6 == 1;
              goto LAB_001b97a6;
            }
            if (bVar1 != 0x6e) {
LAB_001b9b0c:
              parse_error("unrecognized arg type");
            }
            local_2120.argtype = 2;
          }
          else {
            if (bVar1 == 0x6f) {
              local_2120.argtype = 0x10;
              pcVar13 = "o:%c";
              goto LAB_001b9797;
            }
            if (bVar1 != 0x70) goto LAB_001b9b0c;
            local_2120.argtype = 8;
            iVar6 = __isoc99_sscanf(pbVar12,"p:%hx:%hx",&local_2120.field_1,
                                    (undefined1 *)((long)&local_2120.field_1 + 2));
            bVar23 = iVar6 == 2;
LAB_001b97a6:
            if (!bVar23) {
LAB_001b9adc:
              parse_error("Bad command argument");
            }
          }
          iVar6 = get_command_idx(pcVar11);
          command_input(iVar6,local_20fc,&local_2120);
        }
        if (cVar18 == '\0') {
          local_2124 = '\x01';
        }
        goto LAB_001b9973;
      }
      if (bVar1 != 0x21) {
        if (bVar1 == 0x2d) {
          if (((cVar18 == '\0') && (program_state.viewing != 0)) &&
             (loginfo.cmds_are_invalid != '\0')) {
            if (__ptr[1] != 0x2d) {
              parse_error("Error: incorrect message format");
            }
            iVar6 = base64_strlen((char *)(__ptr + 2));
            pcVar11 = (char *)malloc((long)(iVar6 + 2));
            memset(pcVar11,0,(long)(iVar6 + 2));
            base64_decode((char *)(__ptr + 2),pcVar11);
            pline("%s");
            free(pcVar11);
            uVar22 = (ulong)local_2118;
          }
        }
        else if (((bVar1 == 0x3c) && (cVar18 == '\0')) && (loginfo.cmds_are_invalid == '\0')) {
          iVar6 = __isoc99_sscanf(__ptr,"<%x",&local_1ff8);
          if (iVar6 != 1) {
            parse_error("Error: incorrect command result specification\n");
          }
          uVar9 = (uint)local_1ff8.buf;
          uVar7 = mt_nextstate();
          if (uVar9 != (uVar7 & 0xffff)) {
            loginfo.cmds_are_invalid = '\x01';
            raw_printf("The recorded commands seem to be invalid.  Replay will use diffs instead.");
          }
        }
        goto LAB_001b9973;
      }
      pcVar11 = strchr((char *)(__ptr + 1),0x3a);
      if (pcVar11 == (char *)0x0) {
LAB_001b9abf:
        terminate();
      }
      *pcVar11 = '\0';
      pcVar13 = strchr(pcVar11 + 1,0x3a);
      if (pcVar13 == (char *)0x0) goto LAB_001b9abf;
      in = pcVar13 + 1;
      *pcVar13 = '\0';
      base64_decode((char *)(__ptr + 1),(char *)&local_1ff8);
      uVar9 = local_2114;
      cVar18 = pcVar11[1];
      switch(cVar18) {
      case 'a':
        iVar6 = base64_strlen(in);
        pcVar11 = (char *)calloc((long)(iVar6 + 1),1);
        base64_decode(in,pcVar11);
        local_2108.ar = parse_autopickup_rules(pcVar11);
LAB_001b974b:
        free(pcVar11);
        break;
      case 'b':
        iVar6 = atoi(in);
        local_2108.b = (char)iVar6;
        break;
      case 'c':
      case 'd':
      case 'f':
      case 'g':
      case 'h':
switchD_001b9437_caseD_63:
        parse_error("Unrecognized option type");
      case 'e':
        pcVar11 = "%x";
        goto LAB_001b9710;
      case 'i':
        pcVar11 = "%d";
LAB_001b9710:
        __isoc99_sscanf(in,pcVar11,&local_2108);
        break;
      default:
        if (cVar18 == 'm') {
          iVar6 = base64_strlen(in);
          pcVar11 = (char *)calloc((long)(iVar6 + 1),1);
          base64_decode(in,pcVar11);
          local_2108.mt = parse_msgtype_rules(pcVar11);
          goto LAB_001b974b;
        }
        if (cVar18 != 's') goto switchD_001b9437_caseD_63;
        base64_decode(in,(char *)local_20f8);
        local_2108.s = (char *)0x0;
        if ((char)local_20f8[0].next != '\0') {
          local_2108.s = (char *)local_20f8;
        }
      }
      uVar19 = (ulong)uVar9;
      nh_set_option((char *)&local_1ff8,local_2108,'\0');
LAB_001b9973:
      free(__ptr);
      pcVar11 = next_log_token();
      if (pcVar11 == (char *)0x0) {
        __ptr = (byte *)0x0;
      }
      else {
        __ptr = (byte *)strdup(pcVar11);
      }
    } while (__ptr != (byte *)0x0);
  }
  pnVar4 = birth_options;
  birth_options = active_birth_options;
  active_birth_options = pnVar4;
  return local_2124;
code_r0x001b9946:
  uVar15 = uVar15 + 1;
  if ((uint)diff_base.pos == uVar15) goto LAB_001b988a;
  goto LAB_001b993c;
}

Assistant:

boolean replay_run_cmdloop(boolean optonly, boolean singlestep, boolean fast)
{
    char *cmd, *token;
    int count, cmdidx;
    struct nh_cmd_arg cmdarg;
    struct nh_option_desc *tmp;
    boolean did_action = FALSE;
    
    /* the log contains the birth options that are required for this game,
     * so nh_set_option calls during the replay must change active_birth_options */
    tmp = birth_options;
    birth_options = active_birth_options;
    active_birth_options = tmp;

    token = strdupnull(next_log_token());

    while (token) {
	switch (token[0]) {
	    case '!': /* Option */
		replay_read_option(token);
		break;
		
	    case 'T': /* timezone offset */
		replay_read_timezone(token);
		break;
		
	    case '>': /* command */
		if (!optonly && !loginfo.cmds_are_invalid) {
		    replay_read_command(token, &cmd, &count, &cmdarg);
		    cmdidx = get_command_idx(cmd);
		    command_input(cmdidx, count, &cmdarg);
		}
		if (!optonly)
		    did_action = TRUE;
		break;
		
	    case '<': /* a command result */
		if (!optonly)
		    replay_check_cmdresult(token);
		break;

	    case '~': /* a diff */
		if (!optonly || singlestep)
		    replay_check_diff(next_log_token(), optonly, fast);
		if (singlestep)
		    goto out;
		break;

	    case '-': /* a message */
		/* We want to display the welcome messages in the
		 * new-game sequence even if recovering from diffs. */
		if (program_state.viewing && loginfo.cmds_are_invalid && !optonly)
		    replay_check_msg(token);
		break;
	}
	free(token);
	token = strdupnull(next_log_token());
    }

out:
    /* return the birth options to normal */
    tmp = birth_options;
    birth_options = active_birth_options;
    active_birth_options = tmp;
    
    return did_action;
}